

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O0

Translator * __thiscall
helics::ConnectorFederateManager::getTranslator(ConnectorFederateManager *this,int index)

{
  bool bVar1;
  undefined4 in_ESI;
  shared_handle sharedTran;
  StringMappedVector<helics::Translator,_(reference_stability)0,_5> *in_stack_ffffffffffffffa8;
  StringMappedVector<helics::Translator,_(reference_stability)0,_5> *this_00;
  int in_stack_ffffffffffffffe8;
  undefined1 *local_8;
  
  this_00 = (StringMappedVector<helics::Translator,_(reference_stability)0,_5> *)
            &stack0xffffffffffffffd0;
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared((shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
                 *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator*((shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
               *)this_00);
  bVar1 = isValidIndex<int,gmlc::containers::StringMappedVector<helics::Translator,(reference_stability)0,5>>
                    ((int)((ulong)this_00 >> 0x20),in_stack_ffffffffffffffa8);
  if (bVar1) {
    gmlc::libguarded::
    shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::operator*((shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
                 *)&stack0xffffffffffffffd0);
    local_8 = (undefined1 *)
              gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>::
              operator[](this_00,(size_t)in_stack_ffffffffffffffa8);
  }
  else {
    local_8 = invalidTran;
  }
  gmlc::libguarded::
  shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~shared_lock_handle
            ((shared_lock_handle<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
              *)0x3e1e7e);
  return (Translator *)local_8;
}

Assistant:

const Translator& ConnectorFederateManager::getTranslator(int index) const
{
    auto sharedTran = translators.lock_shared();
    if (isValidIndex(index, *sharedTran)) {
        return (*sharedTran)[index];
    }
    return invalidTran;
}